

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

Abc_Ntk_t * Abc_DesDeriveRoot(Abc_Des_t *p)

{
  Abc_Ntk_t *pAVar1;
  
  if (p->vModules->nSize < 2) {
    pAVar1 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,0);
    p->vModules->nSize = 0;
    pAVar1->pManFunc = p->pManFunc;
    p->pManFunc = (void *)0x0;
  }
  else {
    puts("The design includes more than one module and is currently not used.");
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_DesDeriveRoot( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    if ( Vec_PtrSize(p->vModules) > 1 )
    {
        printf( "The design includes more than one module and is currently not used.\n" );
        return NULL;
    }
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( p->vModules, 0 );  Vec_PtrClear( p->vModules );
    pNtk->pManFunc = p->pManFunc;           p->pManFunc = NULL;
    return pNtk;
}